

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-decimal128.c
# Opt level: O3

_Bool bson_decimal128_from_string(char *string,bson_decimal128_t *dec)

{
  byte bVar1;
  ushort *puVar2;
  _Bool _Var3;
  undefined1 extraout_AL;
  undefined1 uVar4;
  int iVar5;
  ushort **ppuVar6;
  long lVar7;
  int iVar8;
  char *in_RCX;
  undefined4 extraout_EDX;
  short *psVar9;
  ulong uVar10;
  char cVar11;
  ulong uVar12;
  bool bVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ushort uVar20;
  undefined8 unaff_R14;
  undefined8 uVar21;
  char *pcVar22;
  char *pcVar23;
  bool bVar24;
  int nread;
  uint16_t digits [34];
  __va_list_tag _Stack_190;
  undefined1 auStack_170 [176];
  bson_decimal128_t *local_b0;
  int local_a4;
  long local_a0;
  undefined8 local_98;
  char *local_90;
  ulong local_88;
  int local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_a4 = 0;
  if (dec == (bson_decimal128_t *)0x0) {
    bson_decimal128_from_string_cold_1();
    uVar4 = extraout_AL;
    if (string != (char *)0x0) {
      *(int *)string = (int)dec;
      *(undefined4 *)(string + 4) = extraout_EDX;
      _Stack_190.reg_save_area = auStack_170;
      _Stack_190.overflow_arg_area = &local_b0;
      _Stack_190.gp_offset = 0x20;
      _Stack_190.fp_offset = 0x30;
      iVar5 = bson_vsnprintf(string + 8,0x1f8,in_RCX,&_Stack_190);
      uVar4 = (undefined1)iVar5;
      string[0x1ff] = '\0';
    }
    return (_Bool)uVar4;
  }
  dec->low = 0;
  dec->high = 0;
  bVar1 = *string;
  if ((bVar1 == 0x2d) || (bVar1 == 0x2b)) {
    uVar21 = CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar1 == 0x2d);
    bVar1 = string[1];
    lVar18 = 1;
    pcVar23 = string + 1;
  }
  else {
    uVar21 = 0;
    lVar18 = 0;
    pcVar23 = string;
  }
  uVar12 = (ulong)bVar1;
  ppuVar6 = __ctype_b_loc();
  puVar2 = *ppuVar6;
  bVar24 = bVar1 == 0x2e;
  if ((!bVar24) && ((puVar2[(char)bVar1] & 0x800) == 0)) {
    _Var3 = _dec128_istreq(pcVar23,"inf");
    if ((!_Var3) && (_Var3 = _dec128_istreq(pcVar23,"infinity"), !_Var3)) {
      _Var3 = _dec128_istreq(pcVar23,"nan");
      dec->high = 0x7c00000000000000;
      dec->low = 0;
      return _Var3;
    }
    dec->high = ((ulong)(byte)~(byte)uVar21 << 0x3f) + 0xf800000000000000;
    dec->low = 0;
    return true;
  }
  local_90 = string;
  psVar9 = (short *)&local_78;
  uVar20 = 0;
  lVar17 = 0;
  uVar10 = 0;
  uVar19 = 0;
  lVar7 = 0;
  bVar13 = false;
  local_88 = 0;
  do {
    pcVar23 = pcVar23 + 2;
    while (pcVar22 = pcVar23, local_b0 = dec, !bVar24) {
      if ((uVar20 < 0x22) && (cVar11 = (char)uVar12, cVar11 != '0' || bVar13)) {
        lVar14 = lVar7;
        if (bVar13 != false) {
          lVar14 = lVar17;
        }
        if (cVar11 != '0') {
          lVar17 = lVar14;
        }
        *psVar9 = cVar11 + -0x30;
        psVar9 = psVar9 + 1;
        uVar20 = uVar20 + 1;
        bVar13 = true;
      }
      uVar19 = uVar19 + bVar13;
      uVar10 = uVar10 + local_88;
      lVar7 = lVar7 + 1;
      uVar12 = (ulong)pcVar22[-1];
      bVar24 = uVar12 == 0x2e;
      pcVar23 = pcVar22 + 1;
      if ((!bVar24) && ((puVar2[uVar12] & 0x800) == 0)) goto LAB_0010f689;
    }
    if (local_88 != 0) goto LAB_0010f6f7;
    pcVar23 = pcVar22 + -1;
    uVar12 = (ulong)pcVar22[-1];
    local_88 = 1;
    bVar24 = uVar12 == 0x2e;
  } while ((bVar24) || ((puVar2[uVar12] & 0x800) != 0));
  local_88 = 1;
LAB_0010f689:
  pcVar23 = pcVar22 + -1;
  if ((lVar7 == 0 & (byte)local_88) == 1) {
LAB_0010f6f7:
    local_b0->high = 0x7c00000000000000;
    local_b0->low = 0;
    return false;
  }
  local_a0 = lVar18;
  local_98 = uVar21;
  if (((uint)uVar12 & 0xff | 0x20) == 0x65) {
    local_7c = 0;
    iVar5 = __isoc99_sscanf(pcVar22,"%d%n",&local_a4,&local_7c);
    if (iVar5 == 0 || local_7c == 0) goto LAB_0010f6f7;
    pcVar23 = pcVar22 + local_7c;
  }
  if (*pcVar23 != '\0') goto LAB_0010f6f7;
  local_88 = local_88 & 0xff;
  if (uVar20 == 0) {
    local_78 = local_78 & 0xffffffffffff0000;
    uVar19 = 1;
    uVar12 = 0;
    uVar15 = 1;
    uVar16 = 0;
  }
  else {
    uVar15 = (ulong)uVar20;
    uVar12 = uVar19 + 1;
    pcVar23 = local_90 + lVar17 + uVar19 + local_a0 + local_88;
    do {
      pcVar23 = pcVar23 + -1;
      uVar12 = uVar12 - 1;
    } while (*pcVar23 == '0');
    uVar16 = (ulong)(uVar20 - 1);
  }
  iVar8 = local_a4 - (int)uVar10;
  iVar5 = -0x1820;
  if (uVar10 - (long)local_a4 < 0x4001) {
    iVar5 = iVar8;
  }
  if (uVar10 < (ulong)(long)local_a4) {
    iVar5 = iVar8;
  }
  if (0x17df < iVar5) {
    do {
      uVar10 = uVar16;
      if (0x21 < uVar10) {
        if (uVar12 != 0) goto LAB_0010f6f7;
        iVar5 = 0x17df;
        break;
      }
      iVar5 = iVar8 + -1;
      bVar24 = 0x17e0 < iVar8;
      uVar16 = uVar10 + 1;
      iVar8 = iVar5;
    } while (bVar24);
    uVar16 = uVar10 + 1;
  }
  bVar24 = uVar15 < uVar19;
  if ((iVar5 < -0x1820) || (uVar15 < uVar19)) {
    iVar8 = iVar5;
    do {
      if (uVar16 == 0) {
        if (uVar12 != 0) goto LAB_0010f6f7;
        iVar5 = -0x1820;
        uVar12 = 0;
        local_78 = 0;
        goto LAB_0010f9a0;
      }
      if (bVar24) {
        if ((uVar12 != 0) && (local_90[uVar19 + local_88 + local_a0 + -1] != '0'))
        goto LAB_0010f6f7;
        uVar19 = uVar19 - 1;
      }
      else {
        if (*(short *)((long)&local_78 + uVar16 * 2) != 0) goto LAB_0010f6f7;
        uVar16 = uVar16 - 1;
      }
      if (iVar8 == 0x17df) goto LAB_0010f6f7;
      iVar5 = iVar8 + 1;
      bVar24 = uVar15 < uVar19;
      bVar13 = iVar8 < -0x1821;
      iVar8 = iVar5;
    } while ((bVar13) || (uVar15 < uVar19));
  }
  if (uVar16 + 1 < uVar12) {
    if (local_90[local_88 + 1 + local_a0 + uVar16 + lVar17] != '0') {
      local_b0->high = 0x7c00000000000000;
      local_b0->low = 0;
      return false;
    }
  }
  else if (uVar12 == 0) {
    uVar12 = 0;
    local_78 = 0;
    goto LAB_0010f9a0;
  }
  local_78 = local_78 & 0xffff;
  if (uVar16 < 0x11) {
    uVar12 = 0;
    if (uVar16 != 0) {
      uVar10 = 0;
      do {
        local_78 = (ulong)*(ushort *)((long)&local_78 + uVar10 * 2 + 2) + local_78 * 10;
        uVar10 = uVar10 + 1;
      } while (uVar16 != uVar10);
    }
  }
  else {
    uVar10 = 1;
    uVar12 = local_78;
    if (uVar16 != 0x11) {
      uVar10 = uVar16 - 0x10;
      lVar18 = 0;
      do {
        uVar12 = (ulong)*(ushort *)((long)&local_78 + lVar18 * 2 + 2) + uVar12 * 10;
        lVar18 = lVar18 + 1;
      } while (uVar16 - 0x11 != lVar18);
    }
    local_78 = (ulong)*(ushort *)((long)&local_78 + uVar10 * 2);
    if (uVar10 < uVar16) {
      do {
        lVar18 = uVar10 * 2;
        uVar10 = uVar10 + 1;
        local_78 = (ulong)*(ushort *)((long)&local_78 + lVar18 + 2) + local_78 * 10;
      } while (uVar16 != uVar10);
    }
  }
LAB_0010f9a0:
  uVar10 = (uVar12 >> 0x20) * 0x5d8a0000;
  uVar19 = (uVar12 & 0xffffffff) * 0x5d8a0000;
  uVar16 = (uVar19 >> 0x20) + (uVar10 & 0xffffffff) + (uVar12 & 0xffffffff) * 0x1634578;
  uVar19 = (uVar19 & 0xffffffff) + local_78 + (uVar16 << 0x20);
  uVar12 = (uVar16 >> 0x20) + (uVar10 >> 0x20) + (uVar12 >> 0x20) * 0x1634578 +
           (ulong)(uVar19 < local_78);
  if ((uVar12 & 0x2000000000000) == 0) {
    uVar12 = uVar12 & 0x1ffffffffffff | (ulong)(iVar5 + 0x1820U & 0x3fff) << 0x31 | local_b0->high;
  }
  else {
    uVar12 = (ulong)(iVar5 + 0x1820U & 0xffff) << 0x2f | local_b0->high | 0x6000000000000000 |
             uVar12 & 0x7fffffffffff;
  }
  local_b0->high = uVar12;
  local_b0->low = uVar19;
  if ((char)local_98 != '\0') {
    local_b0->high = uVar12 | 0x8000000000000000;
    return true;
  }
  return true;
}

Assistant:

bool
bson_decimal128_from_string (const char *string,     /* IN */
                             bson_decimal128_t *dec) /* OUT */
{
   _bson_uint128_6464_t significand = {0};

   const char *str_read = string; /* Read pointer for consuming str. */

   /* Parsing state tracking */
   bool is_negative = false;
   bool saw_radix = false;
   bool includes_sign = false; /* True if the input string contains a sign. */
   bool found_nonzero = false;

   size_t significant_digits = 0; /* Total number of significant digits
                                   * (no leading or trailing zero) */
   size_t ndigits_read = 0;       /* Total number of significand digits read */
   size_t ndigits = 0;        /* Total number of digits (no leading zeros) */
   size_t radix_position = 0; /* The number of the digits after radix */
   size_t first_nonzero = 0;  /* The index of the first non-zero in *str* */

   uint16_t digits[BSON_DECIMAL128_MAX_DIGITS] = {0};
   uint16_t ndigits_stored = 0;      /* The number of digits in digits */
   uint16_t *digits_insert = digits; /* Insertion pointer for digits */
   size_t first_digit = 0;           /* The index of the first non-zero digit */
   size_t last_digit = 0;            /* The index of the last digit */

   int32_t exponent = 0;
   uint64_t significand_high = 0; /* The high 17 digits of the significand */
   uint64_t significand_low = 0;  /* The low 17 digits of the significand */
   uint16_t biased_exponent = 0;  /* The biased exponent */

   BSON_ASSERT (dec);
   dec->high = 0;
   dec->low = 0;

   if (*str_read == '+' || *str_read == '-') {
      is_negative = *(str_read++) == '-';
      includes_sign = true;
   }

   /* Check for Infinity or NaN */
   if (!isdigit (*str_read) && *str_read != '.') {
      if (_dec128_istreq (str_read, "inf") ||
          _dec128_istreq (str_read, "infinity")) {
         BSON_DECIMAL128_SET_INF (*dec, is_negative);
         return true;
      } else if (_dec128_istreq (str_read, "nan")) {
         BSON_DECIMAL128_SET_NAN (*dec);
         return true;
      }

      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Read digits */
   while (isdigit (*str_read) || *str_read == '.') {
      if (*str_read == '.') {
         if (saw_radix) {
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }

         saw_radix = true;
         str_read++;
         continue;
      }

      if (ndigits_stored < 34) {
         if (*str_read != '0' || found_nonzero) {
            if (!found_nonzero) {
               first_nonzero = ndigits_read;
            }

            found_nonzero = true;
            *(digits_insert++) = *(str_read) - '0'; /* Only store 34 digits */
            ndigits_stored++;
         }
      }

      if (found_nonzero) {
         ndigits++;
      }

      if (saw_radix) {
         radix_position++;
      }

      ndigits_read++;
      str_read++;
   }

   if (saw_radix && !ndigits_read) {
      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Read exponent if exists */
   if (*str_read == 'e' || *str_read == 'E') {
      int nread = 0;
#ifdef _MSC_VER
#define SSCANF sscanf_s
#else
#define SSCANF sscanf
#endif
      int read_exponent = SSCANF (++str_read, "%d%n", &exponent, &nread);
      str_read += nread;

      if (!read_exponent || nread == 0) {
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

#undef SSCANF
   }

   if (*str_read) {
      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Done reading input. */
   /* Find first non-zero digit in digits */
   first_digit = 0;

   if (!ndigits_stored) { /* value is zero */
      first_digit = 0;
      last_digit = 0;
      digits[0] = 0;
      ndigits = 1;
      ndigits_stored = 1;
      significant_digits = 0;
   } else {
      last_digit = ndigits_stored - 1;
      significant_digits = ndigits;
      /* Mark trailing zeros as non-significant */
      while (string[first_nonzero + significant_digits - 1 + includes_sign +
                    saw_radix] == '0') {
         significant_digits--;
      }
   }


   /* Normalization of exponent */
   /* Correct exponent based on radix position, and shift significand as needed
    */
   /* to represent user input */

   /* Overflow prevention */
   if (exponent <= radix_position && radix_position - exponent > (1 << 14)) {
      exponent = BSON_DECIMAL128_EXPONENT_MIN;
   } else {
      exponent -= radix_position;
   }

   /* Attempt to normalize the exponent */
   while (exponent > BSON_DECIMAL128_EXPONENT_MAX) {
      /* Shift exponent to significand and decrease */
      last_digit++;

      if (last_digit - first_digit > BSON_DECIMAL128_MAX_DIGITS) {
         /* The exponent is too great to shift into the significand. */
         if (significant_digits == 0) {
            /* Value is zero, we are allowed to clamp the exponent. */
            exponent = BSON_DECIMAL128_EXPONENT_MAX;
            break;
         }

         /* Overflow is not permitted, error. */
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

      exponent--;
   }

   while (exponent < BSON_DECIMAL128_EXPONENT_MIN || ndigits_stored < ndigits) {
      /* Shift last digit */
      if (last_digit == 0) {
         /* underflow is not allowed, but zero clamping is */
         if (significant_digits == 0) {
            exponent = BSON_DECIMAL128_EXPONENT_MIN;
            break;
         }

         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

      if (ndigits_stored < ndigits) {
         if (string[ndigits - 1 + includes_sign + saw_radix] - '0' != 0 &&
             significant_digits != 0) {
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }

         ndigits--; /* adjust to match digits not stored */
      } else {
         if (digits[last_digit] != 0) {
            /* Inexact rounding is not allowed. */
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }


         last_digit--; /* adjust to round */
      }

      if (exponent < BSON_DECIMAL128_EXPONENT_MAX) {
         exponent++;
      } else {
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }
   }

   /* Round */
   /* We've normalized the exponent, but might still need to round. */
   if (last_digit - first_digit + 1 < significant_digits) {
      uint8_t round_digit;

      /* There are non-zero digits after last_digit that need rounding. */
      /* We round to nearest, ties to even */
      round_digit =
         string[first_nonzero + last_digit + includes_sign + saw_radix + 1] -
         '0';

      if (round_digit != 0) {
         /* Inexact (non-zero) rounding is not allowed */
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }
   }

   /* Encode significand */
   significand_high = 0,   /* The high 17 digits of the significand */
      significand_low = 0; /* The low 17 digits of the significand */

   if (significant_digits == 0) { /* read a zero */
      significand_high = 0;
      significand_low = 0;
   } else if (last_digit - first_digit < 17) {
      size_t d_idx = first_digit;
      significand_low = digits[d_idx++];

      for (; d_idx <= last_digit; d_idx++) {
         significand_low *= 10;
         significand_low += digits[d_idx];
         significand_high = 0;
      }
   } else {
      size_t d_idx = first_digit;
      significand_high = digits[d_idx++];

      for (; d_idx <= last_digit - 17; d_idx++) {
         significand_high *= 10;
         significand_high += digits[d_idx];
      }

      significand_low = digits[d_idx++];

      for (; d_idx <= last_digit; d_idx++) {
         significand_low *= 10;
         significand_low += digits[d_idx];
      }
   }

   _mul_64x64 (significand_high, 100000000000000000ull, &significand);
   significand.low += significand_low;

   if (significand.low < significand_low) {
      significand.high += 1;
   }


   biased_exponent = (exponent + (int16_t) BSON_DECIMAL128_EXPONENT_BIAS);

   /* Encode combination, exponent, and significand. */
   if ((significand.high >> 49) & 1) {
      /* Encode '11' into bits 1 to 3 */
      dec->high |= (0x3ull << 61);
      dec->high |= (biased_exponent & 0x3fffull) << 47;
      dec->high |= significand.high & 0x7fffffffffffull;
   } else {
      dec->high |= (biased_exponent & 0x3fffull) << 49;
      dec->high |= significand.high & 0x1ffffffffffffull;
   }

   dec->low = significand.low;

   /* Encode sign */
   if (is_negative) {
      dec->high |= 0x8000000000000000ull;
   }

   return true;
}